

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Unpack(int g_src,int g_dest,int g_mask,int lo,int hi,int *icount)

{
  int in_EAX;
  Integer icnt;
  int local_18 [2];
  
  local_18[0] = in_EAX;
  pnga_unpack((long)g_src,(long)g_dest,(long)g_mask,(long)(lo + 1),(long)(hi + 1),
              (Integer *)local_18);
  *icount = local_18[0];
  return;
}

Assistant:

void GA_Unpack(int g_src, int g_dest, int g_mask, int lo, int hi, int *icount)
{
     Integer a = (Integer)g_src;
     Integer b = (Integer)g_dest;
     Integer s = (Integer)g_mask;
     Integer icnt;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_unpack(a, b, s, alo, ahi, &icnt); 
     *icount = icnt;
}